

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsinput.cpp
# Opt level: O1

void __thiscall soplex::MPSInput::insertName(MPSInput *this,char *name,bool second)

{
  char *pcVar1;
  undefined3 in_register_00000011;
  char **ppcVar2;
  
  this->m_f5 = this->m_f4;
  pcVar1 = this->m_f3;
  this->m_f3 = this->m_f2;
  this->m_f4 = pcVar1;
  if (CONCAT31(in_register_00000011,second) == 0) {
    this->m_f2 = this->m_f1;
    ppcVar2 = &this->m_f1;
  }
  else {
    ppcVar2 = &this->m_f2;
  }
  *ppcVar2 = name;
  return;
}

Assistant:

void MPSInput::insertName(const char* name, bool second)
{
   m_f5 = m_f4;
   m_f4 = m_f3;
   m_f3 = m_f2;

   if(second)
      m_f2 = name;
   else
   {
      m_f2 = m_f1;
      m_f1 = name;
   }
}